

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<long_double>::AddKel
          (TPZMatrix<long_double> *this,TPZFMatrix<long_double> *elmat,TPZVec<long> *source,
          TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  long lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble local_58;
  long local_48;
  long local_40;
  long local_38;
  
  lVar10 = source->fNElements;
  iVar9 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_38 = lVar10;
  if (iVar9 == 0) {
    if (0 < lVar10) {
      local_48 = 0;
      do {
        lVar10 = destinationindex->fStore[local_48];
        lVar1 = source->fStore[local_48];
        local_40 = lVar1 << 4;
        lVar11 = 0;
        lVar12 = in_ST0;
        lVar4 = in_ST1;
        lVar5 = in_ST2;
        lVar6 = in_ST3;
        lVar7 = in_ST4;
        lVar8 = in_ST5;
        do {
          in_ST5 = in_ST6;
          in_ST4 = lVar8;
          in_ST3 = lVar7;
          in_ST2 = lVar6;
          in_ST1 = lVar5;
          in_ST0 = lVar4;
          lVar2 = destinationindex->fStore[lVar11];
          lVar3 = source->fStore[lVar11];
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar10,lVar2);
          if ((((lVar1 < 0) ||
               ((elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar1)) ||
              (lVar3 < 0)) ||
             ((elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar3)) {
            TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_58 = lVar12 + *(longdouble *)
                               ((long)elmat->fElem +
                               local_40 +
                               lVar3 * (elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.
                                       fRow * 0x10);
          in_ST6 = in_ST5;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar10,lVar2,&local_58);
          lVar11 = lVar11 + 1;
          lVar12 = in_ST0;
          lVar4 = in_ST1;
          lVar5 = in_ST2;
          lVar6 = in_ST3;
          lVar7 = in_ST4;
          lVar8 = in_ST5;
        } while (local_38 != lVar11);
        local_48 = local_48 + 1;
      } while (local_48 != local_38);
    }
  }
  else if (0 < lVar10) {
    lVar10 = 0;
    do {
      lVar1 = destinationindex->fStore[lVar10];
      lVar11 = source->fStore[lVar10];
      local_40 = lVar11 << 4;
      lVar12 = in_ST0;
      lVar4 = in_ST1;
      lVar5 = in_ST2;
      lVar6 = in_ST3;
      lVar7 = in_ST4;
      lVar8 = in_ST5;
      local_48 = lVar10;
      do {
        in_ST5 = in_ST6;
        in_ST4 = lVar8;
        in_ST3 = lVar7;
        in_ST2 = lVar6;
        in_ST1 = lVar5;
        in_ST0 = lVar4;
        lVar2 = destinationindex->fStore[lVar10];
        lVar3 = source->fStore[lVar10];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar1,lVar2);
        if (((lVar11 < 0) ||
            ((elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar11)) ||
           ((lVar3 < 0 || ((elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar3))
           )) {
          TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_58 = lVar12 + *(longdouble *)
                             ((long)elmat->fElem +
                             local_40 +
                             lVar3 * (elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow
                             * 0x10);
        in_ST6 = in_ST5;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar1,lVar2,&local_58);
        lVar10 = lVar10 + 1;
        lVar12 = in_ST0;
        lVar4 = in_ST1;
        lVar5 = in_ST2;
        lVar6 = in_ST3;
        lVar7 = in_ST4;
        lVar8 = in_ST5;
      } while (lVar10 < local_38);
      lVar10 = local_48 + 1;
    } while (lVar10 != local_38);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}